

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void template_conformarray(t_template *tfrom,t_template *tto,int *conformaction,_array *a)

{
  t_word tVar1;
  char *pcVar2;
  int iVar3;
  t_template *ptVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  t_word *wp;
  long lVar11;
  long local_70;
  
  if (a->a_templatesym == tfrom->t_sym) {
    iVar8 = tfrom->t_n * 8;
    lVar7 = (long)(tto->t_n << 3);
    pcVar5 = (char *)getbytes(a->a_n * lVar7);
    pcVar2 = a->a_vec;
    if (a->a_elemsize != iVar8) {
      bug("template_conformarray");
    }
    iVar3 = a->a_n;
    if (0 < iVar3) {
      lVar10 = 0;
      pcVar9 = pcVar5;
      do {
        word_init((t_word *)(pcVar5 + lVar10 * lVar7),tto,&a->a_gp);
        wp = (t_word *)(pcVar2 + lVar10 * iVar8);
        iVar3 = tto->t_n;
        if (0 < (long)iVar3) {
          lVar11 = 0;
          do {
            if (-1 < (long)conformaction[lVar11]) {
              tVar1 = *(t_word *)(pcVar9 + lVar11 * 8);
              *(t_word *)(pcVar9 + lVar11 * 8) = wp[conformaction[lVar11]];
              wp[conformaction[lVar11]] = tVar1;
            }
            lVar11 = lVar11 + 1;
          } while (iVar3 != lVar11);
        }
        word_free(wp,tfrom);
        lVar10 = lVar10 + 1;
        iVar3 = a->a_n;
        pcVar9 = pcVar9 + lVar7;
      } while (lVar10 < iVar3);
    }
    a->a_vec = pcVar5;
    freebytes(pcVar2,(long)(iVar3 * iVar8));
    ptVar4 = tto;
  }
  else {
    ptVar4 = (t_template *)pd_findbyclass(a->a_templatesym,template_class);
  }
  uVar6 = (ulong)(uint)a->a_n;
  if (0 < a->a_n) {
    local_70 = 0;
    lVar7 = 0;
    do {
      if (0 < ptVar4->t_n) {
        pcVar2 = a->a_vec;
        lVar11 = 0;
        lVar10 = 0;
        do {
          if (*(int *)((long)&ptVar4->t_vec->ds_type + lVar11) == 3) {
            template_conformarray
                      (tfrom,tto,conformaction,
                       *(_array **)(pcVar2 + lVar10 * 8 + (int)uVar6 * local_70));
          }
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x18;
        } while (lVar10 < ptVar4->t_n);
      }
      lVar7 = lVar7 + 1;
      uVar6 = (ulong)a->a_n;
      local_70 = local_70 + 8;
    } while (lVar7 < (long)uVar6);
  }
  return;
}

Assistant:

static void template_conformarray(t_template *tfrom, t_template *tto,
    int *conformaction, t_array *a)
{
    int i, j;
    t_template *scalartemplate = 0;
    if (a->a_templatesym == tfrom->t_sym)
    {
        /* the array elements must all be conformed */
        int oldelemsize = sizeof(t_word) * tfrom->t_n,
            newelemsize = sizeof(t_word) * tto->t_n;
        char *newarray = getbytes(newelemsize * a->a_n);
        char *oldarray = a->a_vec;
        if (a->a_elemsize != oldelemsize)
            bug("template_conformarray");
        for (i = 0; i < a->a_n; i++)
        {
            t_word *wp = (t_word *)(newarray + newelemsize * i);
            word_init(wp, tto, &a->a_gp);
            template_conformwords(tfrom, tto, conformaction,
                (t_word *)(oldarray + oldelemsize * i), wp);
            word_free((t_word *)(oldarray + oldelemsize * i), tfrom);
        }
        scalartemplate = tto;
        a->a_vec = newarray;
        freebytes(oldarray, oldelemsize * a->a_n);
    }
    else scalartemplate = template_findbyname(a->a_templatesym);
        /* convert all arrays and sublist fields in each element of the array */
    for (i = 0; i < a->a_n; i++)
    {
        t_word *wp = (t_word *)(a->a_vec + sizeof(t_word) * a->a_n * i);
        for (j = 0; j < scalartemplate->t_n; j++)
        {
            t_dataslot *ds = scalartemplate->t_vec + j;
            if (ds->ds_type == DT_ARRAY)
            {
                template_conformarray(tfrom, tto, conformaction,
                    wp[j].w_array);
            }
        }
    }
}